

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,csubstr s,bool was_quoted)

{
  csubstr sp;
  csubstr sp_00;
  csubstr sp_01;
  ro_substr pattern;
  ro_substr chars;
  ro_substr chars_00;
  Location loc;
  csubstr s_00;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  byte in_CL;
  char *in_RDX;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  size_t in_RDI;
  byte bVar4;
  size_t unaff_retaddr;
  bool has_squotes;
  bool has_dquotes;
  bool needs_quotes;
  char (*in_stack_fffffffffffffef8) [33];
  char cVar5;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff00;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  Location *in_stack_ffffffffffffff10;
  basic_substring<const_char> *in_stack_ffffffffffffff18;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar6;
  undefined1 uVar7;
  char c;
  undefined7 uVar8;
  basic_substring<const_char> *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff40;
  basic_substring<const_char> *in_stack_ffffffffffffff48;
  char (*in_stack_ffffffffffffff50) [33];
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  Location *in_stack_ffffffffffffff68;
  basic_substring<const_char> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  basic_substring<char_const> local_60 [16];
  basic_substring<char_const> local_50 [16];
  basic_substring<char_const> local_40 [16];
  ro_substr local_30;
  undefined1 local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  uVar8 = (undefined7)in_RDI;
  cVar5 = (char)(in_RDI >> 0x38);
  if (in_RDX == (char *)0x0) {
    if ((local_19 != 0) ||
       (in_RSI != (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0)) {
      WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
                (in_stack_ffffffffffffff00,(char (*) [3])in_stack_fffffffffffffef8);
    }
  }
  else {
    uVar7 = true;
    c = uVar7;
    if (local_19 == 0) {
      bVar1 = basic_substring<const_char>::is_number
                        ((basic_substring<const_char> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      uVar6 = false;
      in_stack_ffffffffffffff26 = uVar6;
      c = uVar6;
      if (!bVar1) {
        basic_substring<char_const>::basic_substring<10ul>
                  ((basic_substring<char_const> *)&local_30,(char (*) [10])" \n\t\r*&%@`");
        bVar1 = basic_substring<const_char>::begins_with_any
                          ((basic_substring<const_char> *)&stack0xfffffffffffffff0,local_30);
        in_stack_ffffffffffffff25 = true;
        in_stack_ffffffffffffff26 = in_stack_ffffffffffffff25;
        c = in_stack_ffffffffffffff25;
        if (!bVar1) {
          basic_substring<char_const>::basic_substring<3ul>(local_40,(char (*) [3])"<<");
          pattern.str._5_1_ = in_stack_ffffffffffffff25;
          pattern.str._0_5_ = in_stack_ffffffffffffff20;
          pattern.str._6_1_ = uVar6;
          pattern.str._7_1_ = uVar7;
          pattern.len._0_7_ = uVar8;
          pattern.len._7_1_ = cVar5;
          bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff18,pattern);
          in_stack_ffffffffffffff25 = true;
          in_stack_ffffffffffffff26 = in_stack_ffffffffffffff25;
          c = in_stack_ffffffffffffff25;
          if (!bVar1) {
            basic_substring<char_const>::basic_substring<5ul>(local_50,(char (*) [5])" \n\t\r");
            chars.str._5_1_ = in_stack_ffffffffffffff25;
            chars.str._0_5_ = in_stack_ffffffffffffff20;
            chars.str._6_1_ = uVar6;
            chars.str._7_1_ = uVar7;
            chars.len._0_7_ = uVar8;
            chars.len._7_1_ = cVar5;
            bVar1 = basic_substring<const_char>::ends_with_any(in_stack_ffffffffffffff18,chars);
            in_stack_ffffffffffffff25 = true;
            in_stack_ffffffffffffff26 = in_stack_ffffffffffffff25;
            c = in_stack_ffffffffffffff25;
            if (!bVar1) {
              basic_substring<char_const>::basic_substring<13ul>
                        (local_60,(char (*) [13])"#:-?,\n{}[]\'\"");
              chars_00.len = (size_t)in_stack_ffffffffffffff58;
              chars_00.str = *in_stack_ffffffffffffff50;
              sVar3 = basic_substring<const_char>::first_of
                                (in_stack_ffffffffffffff48,chars_00,in_stack_ffffffffffffff40);
              in_stack_ffffffffffffff25 = sVar3 != 0xffffffffffffffff;
              in_stack_ffffffffffffff26 = in_stack_ffffffffffffff25;
              c = in_stack_ffffffffffffff25;
            }
          }
        }
      }
    }
    local_1a = c;
    if ((bool)c == false) {
      sp.len = (size_t)in_stack_ffffffffffffff18;
      sp.str = (char *)in_stack_ffffffffffffff10;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_ffffffffffffff08,sp);
    }
    else {
      sVar3 = basic_substring<const_char>::first_of
                        ((basic_substring<const_char> *)CONCAT17(cVar5,uVar8),c,
                         (size_t)in_stack_ffffffffffffff18);
      bVar4 = sVar3 != 0xffffffffffffffff;
      sVar3 = basic_substring<const_char>::first_of
                        ((basic_substring<const_char> *)CONCAT17(cVar5,uVar8),c,
                         (size_t)in_stack_ffffffffffffff18);
      if ((sVar3 != 0xffffffffffffffff) || ((bVar4 & 1) == 0)) {
        if ((sVar3 != 0xffffffffffffffff) && ((bVar4 & 1) == 0)) {
          sVar3 = basic_substring<const_char>::count
                            (in_stack_ffffffffffffff30,cVar5,
                             CONCAT17(c,CONCAT16(in_stack_ffffffffffffff26,
                                                 CONCAT15(in_stack_ffffffffffffff25,
                                                          in_stack_ffffffffffffff20))));
          if (sVar3 != 0) {
            eVar2 = get_error_flags();
            in_stack_ffffffffffffff18 = in_stack_ffffffffffffff70;
            if (((eVar2 & 1) != 0) &&
               (bVar1 = is_debugger_attached(),
               in_stack_ffffffffffffff18 = in_stack_ffffffffffffff70, bVar1)) {
              trap_instruction();
              in_stack_ffffffffffffff18 = in_stack_ffffffffffffff70;
            }
            Location::Location(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                               (size_t)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
            in_stack_ffffffffffffff10 = in_stack_ffffffffffffff68;
            in_stack_ffffffffffffff08 = in_stack_ffffffffffffff60;
            in_stack_ffffffffffffff00 = in_stack_ffffffffffffff58;
            in_stack_fffffffffffffef8 = in_stack_ffffffffffffff50;
            loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff10;
            loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff08;
            loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff18;
            loc.name.str = (char *)in_stack_ffffffffffffff78;
            loc.name.len = in_stack_ffffffffffffff80;
            error<33ul>(in_stack_fffffffffffffef8,loc);
          }
          cVar5 = (char)((ulong)in_stack_fffffffffffffef8 >> 0x38);
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_ffffffffffffff00,cVar5);
          sp_01.len = (size_t)in_stack_ffffffffffffff18;
          sp_01.str = (char *)in_stack_ffffffffffffff10;
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_ffffffffffffff08,sp_01);
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_ffffffffffffff00,cVar5);
        }
        else {
          s_00.len = unaff_retaddr;
          s_00.str = in_RDX;
          _write_scalar_squo(in_RSI,s_00,in_RDI);
        }
      }
      else {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_ffffffffffffff00,(char)((ulong)in_stack_fffffffffffffef8 >> 0x38));
        cVar5 = (char)((ulong)in_stack_fffffffffffffef8 >> 0x38);
        sp_00.len = (size_t)in_stack_ffffffffffffff18;
        sp_00.str = (char *)in_stack_ffffffffffffff10;
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_ffffffffffffff08,sp_00);
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_ffffffffffffff00,cVar5);
      }
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar(csubstr s, bool was_quoted)
{
    // this block of code needed to be moved to before the needs_quotes
    // assignment to work around a g++ optimizer bug where (s.str != nullptr)
    // was evaluated as true even if s.str was actually a nullptr (!!!)
    if(s.len == size_t(0))
    {
        if(was_quoted || s.str != nullptr)
            this->Writer::_do_write("''");
        return;
    }

    const bool needs_quotes = (
        was_quoted
        ||
        (
            ( ! s.is_number())
            &&
            (
                // has leading whitespace
                // looks like reference or anchor
                // would be treated as a directive
                // see https://www.yaml.info/learn/quote.html#noplain
                s.begins_with_any(" \n\t\r*&%@`")
                ||
                s.begins_with("<<")
                ||
                // has trailing whitespace
                s.ends_with_any(" \n\t\r")
                ||
                // has special chars
                (s.first_of("#:-?,\n{}[]'\"") != npos)
            )
        )
    );

    if( ! needs_quotes)
    {
        this->Writer::_do_write(s);
    }
    else
    {
        const bool has_dquotes = s.first_of( '"') != npos;
        const bool has_squotes = s.first_of('\'') != npos;
        if(!has_squotes && has_dquotes)
        {
            this->Writer::_do_write('\'');
            this->Writer::_do_write(s);
            this->Writer::_do_write('\'');
        }
        else if(has_squotes && !has_dquotes)
        {
            RYML_ASSERT(s.count('\n') == 0);
            this->Writer::_do_write('"');
            this->Writer::_do_write(s);
            this->Writer::_do_write('"');
        }
        else
        {
            _write_scalar_squo(s, /*FIXME FIXME FIXME*/0);
        }
    }
}